

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O0

bool __thiscall
psy::C::Parser::parseDeclarationOrFunctionDefinition_AtDeclarator
          (Parser *this,DeclarationSyntax **decl,SpecifierListSyntax *specList)

{
  bool bVar1;
  SyntaxKind SVar2;
  int iVar3;
  SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*> *pSVar4;
  SyntaxToken *pSVar5;
  SyntaxNode *pSVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  IndexType IVar8;
  ostream *poVar9;
  TypedefDeclarationSyntax *pTVar10;
  Backtracker **ppBVar11;
  ExtKR_ParameterDeclarationListSyntax *local_100;
  ExtKR_ParameterDeclarationListSyntax *paramKRList;
  Backtracker BT;
  VariableAndOrFunctionDeclarationSyntax *varAndOrFuncDecl;
  TypedefDeclarationSyntax *tydefDecl;
  SpecifierListSyntax *iter;
  DeclaratorSyntax *unparenInnerDecltor;
  ArrayOrFunctionDeclaratorSyntax *funcDecltor;
  ArrayOrFunctionDeclaratorSyntax *arrDecltor;
  PointerDeclaratorSyntax *ptrDecltor;
  IdentifierDeclaratorSyntax *identDecltor;
  DeclaratorSyntax *unparenDecltor;
  InitializerSyntax **init;
  DeclaratorSyntax *decltor;
  DeclaratorListSyntax **decltorList_cur;
  DeclaratorListSyntax *decltorList;
  SpecifierListSyntax *specList_local;
  DeclarationSyntax **decl_local;
  Parser *this_local;
  long lVar7;
  
  decltorList_cur = (DeclaratorListSyntax **)0x0;
  decltor = (DeclaratorSyntax *)&decltorList_cur;
  decltorList = (DeclaratorListSyntax *)specList;
  specList_local = (SpecifierListSyntax *)decl;
  decl_local = (DeclarationSyntax **)this;
  while( true ) {
    init = (InitializerSyntax **)0x0;
    bVar1 = parseDeclarator(this,(DeclaratorSyntax **)&init,Unspecified);
    if (!bVar1) break;
    pSVar4 = makeNode<psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax*>,psy::C::DeclaratorSyntax*&>
                       (this,(DeclaratorSyntax **)&init);
    (decltor->super_SyntaxNode).super_Managed._vptr_Managed = (_func_int **)pSVar4;
    unparenDecltor = (DeclaratorSyntax *)0x0;
    pSVar5 = peek(this,1);
    SVar2 = SyntaxToken::kind(pSVar5);
    if (SVar2 != EqualsToken) goto LAB_004053cf;
    pSVar6 = &SyntaxUtilities::unparenthesizeDeclarator((DeclaratorSyntax *)init)->super_SyntaxNode;
    SVar2 = C::SyntaxNode::kind(pSVar6);
    switch(SVar2) {
    case PointerDeclarator:
      iVar3 = (*(pSVar6->super_Managed)._vptr_Managed[0x4e])();
      IVar8 = consume(this);
      *(IndexType *)(CONCAT44(extraout_var_00,iVar3) + 0x38) = IVar8;
      unparenDecltor = (DeclaratorSyntax *)(CONCAT44(extraout_var_00,iVar3) + 0x40);
      break;
    case IdentifierDeclarator:
      iVar3 = (*(pSVar6->super_Managed)._vptr_Managed[0x50])();
      IVar8 = consume(this);
      *(IndexType *)(CONCAT44(extraout_var,iVar3) + 0x30) = IVar8;
      unparenDecltor = (DeclaratorSyntax *)(CONCAT44(extraout_var,iVar3) + 0x38);
      break;
    default:
      goto switchD_00405278_caseD_413;
    case ArrayDeclarator:
      iVar3 = (*(pSVar6->super_Managed)._vptr_Managed[0x56])();
      IVar8 = consume(this);
      *(IndexType *)(CONCAT44(extraout_var_01,iVar3) + 0x38) = IVar8;
      unparenDecltor = (DeclaratorSyntax *)(CONCAT44(extraout_var_01,iVar3) + 0x40);
      break;
    case FunctionDeclarator:
      iVar3 = (*(pSVar6->super_Managed)._vptr_Managed[0x56])();
      lVar7 = CONCAT44(extraout_var_02,iVar3);
      if (*(long *)(lVar7 + 0x20) != 0) {
        pSVar6 = &SyntaxUtilities::unparenthesizeDeclarator(*(DeclaratorSyntax **)(lVar7 + 0x20))->
                  super_SyntaxNode;
        SVar2 = C::SyntaxNode::kind(pSVar6);
        if (SVar2 == PointerDeclarator) {
          IVar8 = consume(this);
          *(IndexType *)(lVar7 + 0x38) = IVar8;
          unparenDecltor = (DeclaratorSyntax *)(lVar7 + 0x40);
          break;
        }
      }
      goto switchD_00405278_caseD_413;
    }
    bVar1 = parseInitializer(this,(InitializerSyntax **)unparenDecltor);
    if (!bVar1) {
      this_local._7_1_ = 0;
      goto LAB_0040572f;
    }
LAB_004053cf:
    pSVar5 = peek(this,1);
    SVar2 = SyntaxToken::kind(pSVar5);
    if (SVar2 == OpenBraceToken) {
      bVar1 = parseFunctionDefinition_AtOpenBrace
                        (this,(DeclarationSyntax **)specList_local,
                         (SpecifierListSyntax *)decltorList,(DeclaratorSyntax **)&init,
                         (ExtKR_ParameterDeclarationListSyntax *)0x0);
      if (bVar1) {
        this_local._7_1_ = 1;
      }
      else {
LAB_004055de:
        if (unparenDecltor == (DeclaratorSyntax *)0x0) {
          Backtracker::Backtracker((Backtracker *)&paramKRList,this,0);
          local_100 = (ExtKR_ParameterDeclarationListSyntax *)0x0;
          bVar1 = parseExtKR_ParameterDeclarationList(this,&local_100);
          if (bVar1) {
            Backtracker::discard((Backtracker *)&paramKRList);
            bVar1 = parseFunctionDefinition_AtOpenBrace
                              (this,(DeclarationSyntax **)specList_local,
                               (SpecifierListSyntax *)decltorList,(DeclaratorSyntax **)&init,
                               local_100);
            if (bVar1) {
              std::
              vector<std::pair<psy::DiagnosticDescriptor,_unsigned_long>,_std::allocator<std::pair<psy::DiagnosticDescriptor,_unsigned_long>_>_>
              ::clear(&(this->diagReporter_).delayedDiags_);
              this_local._7_1_ = 1;
            }
            else {
              this_local._7_1_ = 0;
            }
          }
          else {
            Backtracker::backtrack((Backtracker *)&paramKRList);
            DiagnosticsReporter::ExpectedFollowOfDeclarator(&this->diagReporter_);
            this_local._7_1_ = 0;
          }
          Backtracker::~Backtracker((Backtracker *)&paramKRList);
        }
        else {
          DiagnosticsReporter::ExpectedFollowOfDeclaratorAndInitializer(&this->diagReporter_);
          this_local._7_1_ = 0;
        }
      }
      goto LAB_0040572f;
    }
    if (SVar2 == SemicolonToken) {
      tydefDecl = (TypedefDeclarationSyntax *)decltorList;
      goto LAB_00405445;
    }
    if (SVar2 != CommaToken) goto LAB_004055de;
    IVar8 = consume(this);
    *(int *)((decltor->super_SyntaxNode).super_Managed._vptr_Managed + 5) = (int)IVar8;
    decltor = (DeclaratorSyntax *)((decltor->super_SyntaxNode).super_Managed._vptr_Managed + 2);
  }
  this_local._7_1_ = 0;
LAB_0040572f:
  return (bool)(this_local._7_1_ & 1);
switchD_00405278_caseD_413:
  DiagnosticsReporter::UnexpectedInitializerOfDeclarator(&this->diagReporter_);
  this_local._7_1_ = ignoreDeclarator(this);
  goto LAB_0040572f;
LAB_00405445:
  if (tydefDecl == (TypedefDeclarationSyntax *)0x0) goto LAB_0040554e;
  if ((tydefDecl->super_TypeDeclarationSyntax).super_NamedDeclarationSyntax.super_DeclarationSyntax.
      super_SyntaxNode.tree_ == (SyntaxTree *)0x0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x143);
    poVar9 = std::operator<<(poVar9," ");
    poVar9 = std::operator<<(poVar9,"<empty message>");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
    goto LAB_0040572f;
  }
  SVar2 = C::SyntaxNode::kind((SyntaxNode *)
                              (tydefDecl->super_TypeDeclarationSyntax).super_NamedDeclarationSyntax.
                              super_DeclarationSyntax.super_SyntaxNode.tree_);
  if (SVar2 == TypedefStorageClass) {
    pTVar10 = makeNode<psy::C::TypedefDeclarationSyntax>(this);
    (specList_local->
    super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
    ).super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
    .super_Managed._vptr_Managed = (_func_int **)pTVar10;
    IVar8 = consume(this);
    pTVar10->semicolonTkIdx_ = IVar8;
    pTVar10->specs_ = (SpecifierListSyntax *)decltorList;
    pTVar10->decltors_ = (DeclaratorListSyntax *)decltorList_cur;
    this_local._7_1_ = 1;
    goto LAB_0040572f;
  }
  tydefDecl = *(TypedefDeclarationSyntax **)
               &(tydefDecl->super_TypeDeclarationSyntax).super_NamedDeclarationSyntax.
                super_DeclarationSyntax.super_SyntaxNode.kind_;
  goto LAB_00405445;
LAB_0040554e:
  BT.chained_.c.
  super__Deque_base<const_psy::C::Parser::Backtracker_*,_std::allocator<const_psy::C::Parser::Backtracker_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)makeNode<psy::C::VariableAndOrFunctionDeclarationSyntax>(this);
  (specList_local->
  super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
  ).super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>.
  super_Managed._vptr_Managed =
       (_func_int **)
       BT.chained_.c.
       super__Deque_base<const_psy::C::Parser::Backtracker_*,_std::allocator<const_psy::C::Parser::Backtracker_*>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppBVar11 = (Backtracker **)consume(this);
  BT.chained_.c.
  super__Deque_base<const_psy::C::Parser::Backtracker_*,_std::allocator<const_psy::C::Parser::Backtracker_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node[7] = ppBVar11;
  BT.chained_.c.
  super__Deque_base<const_psy::C::Parser::Backtracker_*,_std::allocator<const_psy::C::Parser::Backtracker_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node[5] = (Backtracker **)decltorList;
  BT.chained_.c.
  super__Deque_base<const_psy::C::Parser::Backtracker_*,_std::allocator<const_psy::C::Parser::Backtracker_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node[6] = (Backtracker **)decltorList_cur;
  this_local._7_1_ = 1;
  goto LAB_0040572f;
}

Assistant:

bool Parser::parseDeclarationOrFunctionDefinition_AtDeclarator(
        DeclarationSyntax*& decl,
        const SpecifierListSyntax* specList)
{
    DeclaratorListSyntax* decltorList = nullptr;
    DeclaratorListSyntax** decltorList_cur = &decltorList;

    while (true) {
        DeclaratorSyntax* decltor = nullptr;
        if (!parseDeclarator(decltor, DeclarationContext::Unspecified))
            return false;

        *decltorList_cur = makeNode<DeclaratorListSyntax>(decltor);

        InitializerSyntax** init = nullptr;
        if (peek().kind() == SyntaxKind::EqualsToken) {
            DeclaratorSyntax* unparenDecltor = const_cast<DeclaratorSyntax*>(
                    SyntaxUtilities::unparenthesizeDeclarator(decltor));
            switch (unparenDecltor->kind()) {
                case SyntaxKind::IdentifierDeclarator: {
                    auto identDecltor = unparenDecltor->asIdentifierDeclarator();
                    identDecltor->equalsTkIdx_ = consume();
                    init = &identDecltor->init_;
                    break;
                }

                case SyntaxKind::PointerDeclarator: {
                    auto ptrDecltor = unparenDecltor->asPointerDeclarator();
                    ptrDecltor->equalsTkIdx_ = consume();
                    init = &ptrDecltor->init_;
                    break;
                }

                case SyntaxKind::ArrayDeclarator: {
                    auto arrDecltor = unparenDecltor->asArrayOrFunctionDeclarator();
                    arrDecltor->equalsTkIdx_ = consume();
                    init = &arrDecltor->init_;
                    break;
                }

                case SyntaxKind::FunctionDeclarator: {
                    auto funcDecltor = unparenDecltor->asArrayOrFunctionDeclarator();
                    if (funcDecltor->innerDecltor_) {
                        auto unparenInnerDecltor = const_cast<DeclaratorSyntax*>(
                                    SyntaxUtilities::unparenthesizeDeclarator(funcDecltor->innerDecltor_));
                        if (unparenInnerDecltor->kind() == SyntaxKind::PointerDeclarator) {
                            funcDecltor->equalsTkIdx_ = consume();
                            init = &funcDecltor->init_;
                            break;
                        }
                    }
                    [[fallthrough]];
                }

                default:
                    diagReporter_.UnexpectedInitializerOfDeclarator();
                    return ignoreDeclarator();
            }
            if (!parseInitializer(*init))
                return false;
        }

        switch (peek().kind()) {
            case SyntaxKind::CommaToken:
                (*decltorList_cur)->delimTkIdx_ = consume();
                break;

            case SyntaxKind::SemicolonToken: {
                for (auto iter = specList; iter; iter = iter->next) {
                    PSY_ASSERT_2(iter->value, return false);
                    if (iter->value->kind() == SyntaxKind::TypedefStorageClass) {
                        auto tydefDecl = makeNode<TypedefDeclarationSyntax>();
                        decl = tydefDecl;
                        tydefDecl->semicolonTkIdx_ = consume();
                        tydefDecl->specs_ = const_cast<SpecifierListSyntax*>(specList);
                        tydefDecl->decltors_ = decltorList;
                        return true;
                    }
                }

                auto varAndOrFuncDecl = makeNode<VariableAndOrFunctionDeclarationSyntax>();
                decl = varAndOrFuncDecl;
                varAndOrFuncDecl->semicolonTkIdx_ = consume();
                varAndOrFuncDecl->specs_ = const_cast<SpecifierListSyntax*>(specList);
                varAndOrFuncDecl->decltors_ = decltorList;
                return true;
            }

            case SyntaxKind::OpenBraceToken:
                if (parseFunctionDefinition_AtOpenBrace(decl, specList, decltor, nullptr))
                    return true;
                [[fallthrough]];

            default: {
                if (init) {
                    diagReporter_.ExpectedFollowOfDeclaratorAndInitializer();
                    return false;
                }

                Backtracker BT(this);
                ExtKR_ParameterDeclarationListSyntax* paramKRList = nullptr;
                if (parseExtKR_ParameterDeclarationList(paramKRList)) {
                    BT.discard();
                    if (parseFunctionDefinition_AtOpenBrace(decl, specList, decltor, paramKRList)) {
                        diagReporter_.delayedDiags_.clear();
                        return true;
                    }
                    return false;
                }
                BT.backtrack();

                diagReporter_.ExpectedFollowOfDeclarator();
                return false;
            }
        }

        decltorList_cur = &(*decltorList_cur)->next;
    }
}